

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O0

Aig_Man_t * Ssw_LatchCorrespondence(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  Aig_Man_t *pAVar1;
  undefined1 local_c8 [8];
  Ssw_Pars_t Pars;
  Aig_Man_t *pRes;
  Ssw_Pars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  pRes = (Aig_Man_t *)pPars;
  if (pPars == (Ssw_Pars_t *)0x0) {
    pRes = (Aig_Man_t *)local_c8;
    Ssw_ManSetDefaultParamsLcorr((Ssw_Pars_t *)local_c8);
  }
  pAVar1 = Ssw_SignalCorrespondence(pAig,(Ssw_Pars_t *)pRes);
  return pAVar1;
}

Assistant:

Aig_Man_t * Ssw_LatchCorrespondence( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pRes;
    Ssw_Pars_t Pars;
    if ( pPars == NULL )
        Ssw_ManSetDefaultParamsLcorr( pPars = &Pars );
    pRes = Ssw_SignalCorrespondence( pAig, pPars );
//    if ( pPars->fConstrs && pPars->fVerbose )
//        Ssw_ReportConeReductions( pAig, pRes );
    return pRes;
}